

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O3

bool __thiscall ASDCP::Dictionary::AddEntry(Dictionary *this,MDDEntry *Entry,ui32_t index)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  MDDEntry *pMVar5;
  undefined5 uVar6;
  ILogSink *pIVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  char *pcVar10;
  _Base_ptr p_Var11;
  undefined4 uVar12;
  bool bVar13;
  allocator<char> local_cd;
  undefined4 local_cc;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,ASDCP::UL>,std::_Select1st<std::pair<unsigned_int_const,ASDCP::UL>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ASDCP::UL>>>
  *local_c8;
  key_type local_c0;
  undefined1 local_a0 [8];
  bool local_98;
  byte_t abStack_97 [7];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  ui32_t local_80;
  char buf [64];
  
  if (index < 0x246) {
    p_Var8 = (this->m_md_rev_lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_cc = (undefined4)CONCAT71((int7)((ulong)this >> 8),1);
    if (p_Var8 != (_Base_ptr)0x0) {
      p_Var1 = &(this->m_md_rev_lookup)._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var1->_M_header;
      do {
        bVar13 = p_Var8[1]._M_color < index;
        if (!bVar13) {
          p_Var11 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[bVar13];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var11 != p_Var1) && (p_Var11[1]._M_color <= index)) {
        DeleteEntry(this,index);
        local_cc = 0;
      }
    }
    local_c8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,ASDCP::UL>,std::_Select1st<std::pair<unsigned_int_const,ASDCP::UL>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ASDCP::UL>>>
                *)&this->m_md_rev_lookup;
    local_c0.super_Identifier<16U>.m_HasValue = true;
    local_c0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Entry->ul;
    local_c0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Entry->ul + 8);
    local_c0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0021d318;
    iVar9 = std::
            _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
            ::find((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
                    *)this,&local_c0);
    if ((_Rb_tree_header *)iVar9._M_node != &(this->m_md_lookup)._M_t._M_impl.super__Rb_tree_header)
    {
      pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar10 = UL::EncodeString(&local_c0,buf,0x40);
      _Var2 = iVar9._M_node[2]._M_color;
      Kumu::ILogSink::Warn
                (pIVar7,"Duplicate Dictionary item: %s (%02x, %02x) %s | (%02x, %02x) %s\n",pcVar10,
                 (ulong)this->m_MDD_Table[_Var2].tag.a,(ulong)this->m_MDD_Table[_Var2].tag.b,
                 this->m_MDD_Table[_Var2].name,(ulong)(Entry->tag).a,(ulong)(Entry->tag).b,
                 Entry->name);
    }
    local_98 = local_c0.super_Identifier<16U>.m_HasValue;
    abStack_97 = local_c0.super_Identifier<16U>.m_Value._0_7_;
    aStack_90._M_local_buf[0] = local_c0.super_Identifier<16U>.m_Value[7];
    aStack_90._M_allocated_capacity._1_7_ = local_c0.super_Identifier<16U>.m_Value._8_7_;
    aStack_90._M_local_buf[8] = local_c0.super_Identifier<16U>.m_Value[0xf];
    local_a0 = (undefined1  [8])&PTR__IArchive_0021d318;
    local_80 = index;
    std::
    _Rb_tree<ASDCP::UL,std::pair<ASDCP::UL_const,unsigned_int>,std::_Select1st<std::pair<ASDCP::UL_const,unsigned_int>>,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,unsigned_int>>>
    ::_M_insert_unique<std::pair<ASDCP::UL_const,unsigned_int>>
              ((_Rb_tree<ASDCP::UL,std::pair<ASDCP::UL_const,unsigned_int>,std::_Select1st<std::pair<ASDCP::UL_const,unsigned_int>>,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,unsigned_int>>>
                *)this,(pair<const_ASDCP::UL,_unsigned_int> *)local_a0);
    local_a0._0_4_ = index;
    aStack_90._M_local_buf[0] = local_c0.super_Identifier<16U>.m_HasValue;
    aStack_90._M_allocated_capacity._1_7_ = local_c0.super_Identifier<16U>.m_Value._0_7_;
    aStack_90._M_local_buf[8] = local_c0.super_Identifier<16U>.m_Value[7];
    aStack_90._9_7_ = local_c0.super_Identifier<16U>.m_Value._8_7_;
    local_80._0_1_ = local_c0.super_Identifier<16U>.m_Value[0xf];
    local_98 = true;
    abStack_97[0] = 0xd3;
    abStack_97[1] = '!';
    abStack_97[2] = '\0';
    abStack_97[3] = '\0';
    abStack_97[4] = '\0';
    abStack_97[5] = '\0';
    abStack_97[6] = '\0';
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,ASDCP::UL>,std::_Select1st<std::pair<unsigned_int_const,ASDCP::UL>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ASDCP::UL>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,ASDCP::UL>>
              (local_c8,(pair<const_unsigned_int,_ASDCP::UL> *)local_a0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,Entry->name,&local_cd);
    local_80 = index;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)&this->m_md_sym_lookup,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_a0);
    uVar12 = local_cc;
    if (local_a0 != (undefined1  [8])&aStack_90) {
      operator_delete((void *)local_a0,
                      CONCAT71(aStack_90._M_allocated_capacity._1_7_,aStack_90._M_local_buf[0]) + 1)
      ;
    }
    uVar3 = *(undefined8 *)Entry->ul;
    uVar4 = *(undefined8 *)(Entry->ul + 8);
    bVar13 = Entry->optional;
    uVar6 = *(undefined5 *)&Entry->field_0x13;
    pcVar10 = Entry->name;
    pMVar5 = this->m_MDD_Table + index;
    pMVar5->tag = Entry->tag;
    pMVar5->optional = bVar13;
    *(undefined5 *)&pMVar5->field_0x13 = uVar6;
    *(char **)(&pMVar5->tag + 4) = pcVar10;
    *(undefined8 *)this->m_MDD_Table[index].ul = uVar3;
    *(undefined8 *)(this->m_MDD_Table[index].ul + 8) = uVar4;
  }
  else {
    pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
    uVar12 = 0;
    Kumu::ILogSink::Warn(pIVar7,"UL Dictionary: index exceeds maximum: %d\n",(ulong)index);
  }
  return SUB41(uVar12,0);
}

Assistant:

bool
ASDCP::Dictionary::AddEntry(const MDDEntry& Entry, ui32_t index)
{
  if ( index >= (ui32_t)MDD_Max )
    {
      Kumu::DefaultLogSink().Warn("UL Dictionary: index exceeds maximum: %d\n", index);
      return false;
    }

  bool result = true;
  // is this index already there?
  std::map<ui32_t, ASDCP::UL>::iterator rii = m_md_rev_lookup.find(index);

  if ( rii != m_md_rev_lookup.end() )
    {
      DeleteEntry(index);
      result = false;
    }

  UL TmpUL(Entry.ul);

#define MDD_AUTHORING_MODE
#ifdef MDD_AUTHORING_MODE
  char buf[64];
  std::map<ASDCP::UL, ui32_t>::iterator ii = m_md_lookup.find(TmpUL);
  if ( ii != m_md_lookup.end() )
    {
      Kumu::DefaultLogSink().Warn("Duplicate Dictionary item: %s (%02x, %02x) %s | (%02x, %02x) %s\n",
	      TmpUL.EncodeString(buf, 64),
	      m_MDD_Table[ii->second].tag.a, m_MDD_Table[ii->second].tag.b,
	      m_MDD_Table[ii->second].name,
	      Entry.tag.a, Entry.tag.b, Entry.name);
    }
#endif

  m_md_lookup.insert(std::map<UL, ui32_t>::value_type(TmpUL, index));
  m_md_rev_lookup.insert(std::map<ui32_t, UL>::value_type(index, TmpUL));
  m_md_sym_lookup.insert(std::map<std::string, ui32_t>::value_type(Entry.name, index));
  m_MDD_Table[index] = Entry;

  return result;
}